

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O3

void cfl_subsample_lbd_420_16x32_ssse3(uint8_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  short *psVar1;
  undefined1 auVar2 [16];
  __m128i *pred_buf_m128i;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar2 = _DAT_00514c70;
  uVar3 = 0xffffffffffffffc0;
  do {
    auVar4 = pmaddubsw(*(undefined1 (*) [16])cfl_type,auVar2);
    auVar5 = pmaddubsw(*(undefined1 (*) [16])(*(undefined1 (*) [16])cfl_type + input_stride),auVar2)
    ;
    psVar1 = (short *)((long)output_q3 + uVar3 + 0x40);
    *psVar1 = auVar5._0_2_ + auVar4._0_2_;
    psVar1[1] = auVar5._2_2_ + auVar4._2_2_;
    psVar1[2] = auVar5._4_2_ + auVar4._4_2_;
    psVar1[3] = auVar5._6_2_ + auVar4._6_2_;
    psVar1[4] = auVar5._8_2_ + auVar4._8_2_;
    psVar1[5] = auVar5._10_2_ + auVar4._10_2_;
    psVar1[6] = auVar5._12_2_ + auVar4._12_2_;
    psVar1[7] = auVar5._14_2_ + auVar4._14_2_;
    cfl_type = *(undefined1 (*) [16])cfl_type + input_stride * 2;
    uVar3 = uVar3 + 0x40;
  } while (uVar3 < 0x3c0);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_420_lbd_ssse3(const uint8_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const __m128i twos = _mm_set1_epi8(2);
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + (height >> 1) * CFL_BUF_LINE_I128;
  const int luma_stride = input_stride << 1;
  do {
    if (width == 4) {
      __m128i top = _mm_loadh_epi32((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadh_epi32((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storeh_epi32(pred_buf_m128i, sum);
    } else if (width == 8) {
      __m128i top = _mm_loadl_epi64((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadl_epi64((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storel_epi64(pred_buf_m128i, sum);
    } else {
      __m128i top = _mm_loadu_si128((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadu_si128((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storeu_si128(pred_buf_m128i, sum);
      if (width == 32) {
        __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        __m128i bot_1 =
            _mm_loadu_si128(((__m128i *)(input + input_stride)) + 1);
        top_1 = _mm_maddubs_epi16(top_1, twos);
        bot_1 = _mm_maddubs_epi16(bot_1, twos);
        __m128i sum_1 = _mm_add_epi16(top_1, bot_1);
        _mm_storeu_si128(pred_buf_m128i + 1, sum_1);
      }
    }
    input += luma_stride;
    pred_buf_m128i += CFL_BUF_LINE_I128;
  } while (pred_buf_m128i < end);
}